

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeInt.hpp
# Opt level: O0

bool DivisionNegativeCornerCaseHelper<short,_unsigned_long_long,_safeint_exception_handlers::SafeInt_InvalidParameter,_1>
     ::NegativeCornerCase
               (unsigned_long_long lhs,
               SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter> rhs,
               SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter> *result)

{
  short sVar1;
  div_t dVar2;
  short *in_RDX;
  int in_EDI;
  short minT;
  short maxT;
  unsigned_long_long tmp;
  undefined6 in_stack_ffffffffffffffd0;
  SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter> in_stack_ffffffffffffffd6;
  short local_28;
  short local_26;
  short local_24;
  SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter> local_22;
  div_t local_20;
  short *local_18;
  int local_10;
  
  local_18 = in_RDX;
  local_10 = in_EDI;
  sVar1 = ::SafeInt::operator_cast_to_short
                    ((SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
                     CONCAT26(in_stack_ffffffffffffffd6.m_int,in_stack_ffffffffffffffd0));
  dVar2 = division_negative_negateU<short,_unsigned_long_long,_false>::div((int)sVar1,local_10);
  local_20 = dVar2;
  sVar1 = std::numeric_limits<short>::max();
  if ((ulong)(long)sVar1 < (ulong)dVar2) {
    local_26 = std::numeric_limits<short>::max();
    if (local_20 != (div_t)((long)local_26 + 1)) {
      safeint_exception_handlers::SafeInt_InvalidParameter::SafeIntOnOverflow();
    }
    local_28 = std::numeric_limits<short>::min();
    SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter>::SafeInt
              ((SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
               &stack0xffffffffffffffd6,&local_28);
    *local_18 = in_stack_ffffffffffffffd6.m_int;
  }
  else {
    local_24 = ((ushort)local_20.quot ^ 0xffff) + 1;
    SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter>::SafeInt
              (&local_22,&local_24);
    *local_18 = local_22.m_int;
  }
  return true;
}

Assistant:

SAFE_INT_NODISCARD static bool NegativeCornerCase( U lhs, SafeInt< T, E > rhs, SafeInt<T, E>& result ) SAFEINT_CPP_THROW
    {
        // Problem case - normal casting behavior changes meaning
        // flip rhs to positive
        // any operator casts now do the right thing
        U tmp = division_negative_negateU< T, U, sizeof(T) == 4>::div(rhs, lhs);

        if( tmp <= (U)std::numeric_limits<T>::max() )
        {
            result = SafeInt< T, E >( (T)(~(std::uint64_t)tmp + 1) );
            return true;
        }

        // Corner case
        T maxT = std::numeric_limits<T>::max();
        if( tmp == (U)maxT + 1 )
        {
            T minT = std::numeric_limits<T>::min();
            result = SafeInt< T, E >( minT );
            return true;
        }

        E::SafeIntOnOverflow();
    }